

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.h
# Opt level: O0

load_messages_table * load_messages_create(uint32_t capacity)

{
  pthread_mutex_t *x;
  load_messages_table_cell_struct *plVar1;
  load_messages_table *table;
  uint32_t capacity_local;
  
  x = (pthread_mutex_t *)calloc(1,0x48);
  init_recursive_mutex(x);
  plVar1 = load_messagesalloc_cells((load_messages_table *)&x->__data,capacity);
  *(load_messages_table_cell_struct **)((long)x + 0x40) = plVar1;
  x[1].__data.__lock = capacity;
  return (load_messages_table *)x;
}

Assistant:

static PREFIX(_table) *PREFIX(_create)(uint32_t capacity)
{
	PREFIX(_table) *table = CALLOC(1, sizeof(PREFIX(_table)));
#	ifndef MAP_TABLE_NO_LOCK
	INIT_LOCK(table->lock);
#	endif
#	if defined(ENABLE_GC) && defined(MAP_TABLE_TYPES_BITMAP)
	// The low word in the bitmap stores the offsets of the next entries
	GC_word bitmap = (MAP_TABLE_TYPES_BITMAP << 1);
	table->descr = GC_make_descriptor(&bitmap,
			sizeof(struct PREFIX(_table_cell_struct)) / sizeof (void*));
#	endif
	table->table = PREFIX(alloc_cells)(table, capacity);
	table->table_size = capacity;
	return table;
}